

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

UINT8 ReadComprDataBlkHdr(UINT32 inLen,UINT8 *inData,PCM_CDB_INF *retCdbInf)

{
  UINT16 UVar1;
  UINT32 UVar2;
  UINT32 curPos;
  PCM_CMP_INF *cParam;
  PCM_CDB_INF *retCdbInf_local;
  UINT8 *inData_local;
  UINT32 inLen_local;
  
  if (inLen < 5) {
    inData_local._7_1_ = '\x10';
  }
  else {
    (retCdbInf->cmprInfo).comprType = *inData;
    UVar2 = ReadLE32(inData + 1);
    retCdbInf->decmpLen = UVar2;
    retCdbInf->hdrSize = 0;
    if ((retCdbInf->cmprInfo).comprType < 2) {
      if (inLen < 10) {
        inData_local._7_1_ = '\x10';
      }
      else {
        (retCdbInf->cmprInfo).bitsDec = inData[5];
        (retCdbInf->cmprInfo).bitsCmp = inData[6];
        (retCdbInf->cmprInfo).subType = inData[7];
        UVar1 = ReadLE16(inData + 8);
        (retCdbInf->cmprInfo).baseVal = UVar1;
        retCdbInf->hdrSize = 10;
        inData_local._7_1_ = '\0';
      }
    }
    else {
      inData_local._7_1_ = 0x80;
    }
  }
  return inData_local._7_1_;
}

Assistant:

UINT8 ReadComprDataBlkHdr(UINT32 inLen, const UINT8* inData, PCM_CDB_INF* retCdbInf)
{
	PCM_CMP_INF* cParam;
	UINT32 curPos;
	
	if (inLen < 0x05)
		return 0x10;	// not enough data
	
	cParam = &retCdbInf->cmprInfo;
	cParam->comprType = inData[0x00];
	retCdbInf->decmpLen = ReadLE32(&inData[0x01]);
	retCdbInf->hdrSize = 0x00;
	curPos = 0x05;
	
	switch(cParam->comprType)
	{
	case 0x00:	// Bit Packing compression
	case 0x01:	// Delta-PCM
		if (inLen < curPos + 0x05)
			return 0x10;	// not enough data
		cParam->bitsDec = inData[curPos + 0x00];
		cParam->bitsCmp = inData[curPos + 0x01];
		cParam->subType = inData[curPos + 0x02];	// ignored for DPCM
		cParam->baseVal = ReadLE16(&inData[curPos + 0x03]);
		//cParam->comprTbl = NULL;	// keep the value
		curPos += 0x05;
		break;
	default:
		return 0x80;	// Error: unknown data block compression
	}
	
	retCdbInf->hdrSize = curPos;
	return 0x00;
}